

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_decoder.c
# Opt level: O2

lzma_ret stream_decoder_reset(lzma_stream_coder *coder,lzma_allocator *allocator)

{
  lzma_ret lVar1;
  lzma_index_hash *plVar2;
  
  plVar2 = lzma_index_hash_init(coder->index_hash,allocator);
  coder->index_hash = plVar2;
  if (plVar2 == (lzma_index_hash *)0x0) {
    lVar1 = LZMA_MEM_ERROR;
  }
  else {
    coder->sequence = SEQ_STREAM_HEADER;
    coder->pos = 0;
    lVar1 = LZMA_OK;
  }
  return lVar1;
}

Assistant:

static lzma_ret
stream_decoder_reset(lzma_stream_coder *coder, const lzma_allocator *allocator)
{
	// Initialize the Index hash used to verify the Index.
	coder->index_hash = lzma_index_hash_init(coder->index_hash, allocator);
	if (coder->index_hash == NULL)
		return LZMA_MEM_ERROR;

	// Reset the rest of the variables.
	coder->sequence = SEQ_STREAM_HEADER;
	coder->pos = 0;

	return LZMA_OK;
}